

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

int __thiscall
ddd::DictionaryMLT<true,_true>::stat(DictionaryMLT<true,_true> *this,char *__file,stat *__buf)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  *(undefined8 *)__file = *(undefined8 *)(this + 0x30);
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  plVar2 = *(long **)(this + 8);
  lVar3 = *plVar2;
  lVar8 = plVar2[1];
  uVar9 = (ulong)(lVar8 - lVar3) >> 3;
  uVar14 = (ulong)*(uint *)((long)plVar2 + 100);
  local_48 = uVar9 & 0xffffffff;
  local_58 = (ulong)((int)uVar9 - *(uint *)((long)plVar2 + 100));
  *(ulong *)(__file + 0x10) = local_58;
  *(ulong *)(__file + 0x18) = local_48;
  local_50 = (ulong)(plVar2[2] - lVar3) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x20) = local_50;
  *(ulong *)(__file + 0x28) = uVar14;
  lVar12 = plVar2[3];
  lVar10 = plVar2[4];
  iVar11 = (int)lVar12;
  uVar16 = (ulong)(uint)((int)lVar10 - iVar11);
  *(ulong *)(__file + 0x30) = uVar16;
  uVar15 = (ulong)(uint)((int)plVar2[5] - iVar11);
  *(ulong *)(__file + 0x38) = uVar15;
  uVar9 = (ulong)*(uint *)(plVar2 + 0xd);
  *(ulong *)(__file + 0x40) = uVar9;
  lVar8 = ((lVar8 + lVar10 + plVar2[7] + plVar2[10]) - (lVar3 + lVar12 + plVar2[6] + plVar2[9])) +
          0x2c;
  lVar3 = *(long *)(this + 0x10);
  lVar12 = *(long *)(this + 0x18) - lVar3;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    lVar10 = 1;
    lVar17 = 0;
    do {
      plVar2 = *(long **)(lVar3 + lVar17 * 8);
      if (plVar2 != (long *)0x0) {
        lVar4 = *plVar2;
        lVar5 = plVar2[1];
        uVar13 = (ulong)(lVar5 - lVar4) >> 3;
        uVar1 = *(uint *)((long)plVar2 + 100);
        local_58 = local_58 + ((int)uVar13 - uVar1);
        *(ulong *)(__file + 0x10) = local_58;
        local_48 = local_48 + (uVar13 & 0xffffffff);
        *(ulong *)(__file + 0x18) = local_48;
        local_50 = local_50 + ((ulong)(plVar2[2] - lVar4) >> 3 & 0xffffffff);
        *(ulong *)(__file + 0x20) = local_50;
        uVar14 = uVar14 + uVar1;
        *(ulong *)(__file + 0x28) = uVar14;
        lVar6 = plVar2[3];
        lVar7 = plVar2[4];
        iVar11 = (int)lVar6;
        uVar16 = uVar16 + (uint)((int)lVar7 - iVar11);
        *(ulong *)(__file + 0x30) = uVar16;
        uVar15 = uVar15 + (uint)((int)plVar2[5] - iVar11);
        *(ulong *)(__file + 0x38) = uVar15;
        uVar9 = uVar9 + *(uint *)(plVar2 + 0xd);
        *(ulong *)(__file + 0x40) = uVar9;
        lVar8 = lVar8 + ((lVar5 + lVar7 + plVar2[7] + plVar2[10]) -
                        (lVar4 + lVar6 + plVar2[6] + plVar2[9])) + 0x2c;
        lVar10 = lVar10 + 1;
        *(long *)(__file + 8) = lVar10;
      }
      lVar8 = lVar8 + 1;
      lVar17 = lVar17 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar17);
  }
  *(long *)(__file + 0x48) = lVar8 + 0x14;
  return (int)(lVar8 + 0x14);
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }